

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O0

uchar rule_p2_p3(BidiType *types,size_t size)

{
  BidiType t_00;
  _Bool _Var1;
  size_t sStack_28;
  BidiType t;
  size_t i;
  size_t size_local;
  BidiType *types_local;
  
  sStack_28 = 0;
  do {
    if (size <= sStack_28) {
      return '\0';
    }
    t_00 = types[sStack_28];
    _Var1 = typeIsIsolateInitiator(t_00);
    if (_Var1) {
      sStack_28 = find_matching_pdi(types,sStack_28,size);
    }
    else {
      _Var1 = typeIsStrong(t_00);
      if (_Var1) {
        return t_00 != L;
      }
    }
    sStack_28 = sStack_28 + 1;
  } while( true );
}

Assistant:

static unsigned char rule_p2_p3(const BidiType *types, size_t size)
{
    /*
     * Rule P2. Find the first strong type (L, R or AL), ignoring
     * anything inside an isolated segment.
     *
     * Rule P3. If that type is R or AL, choose a paragraph embeddding
     * level of 1, otherwise 0.
     */
    for (size_t i = 0; i < size; i++) {
        BidiType t = types[i];
        if (typeIsIsolateInitiator(t))
            i = find_matching_pdi(types, i, size);
        else if (typeIsStrong(t))
            return (t == L ? 0 : 1);
    }

    return 0; /* default if no strong type found */
}